

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

void flatbuffers::Print<signed_char>
               (char val,Type type,int indent,int indent_step,StructDef *param_5,string *_text)

{
  string local_30;
  
  NumToString<signed_char>(&local_30,val);
  std::__cxx11::string::append((string *)_text);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Print(T val, Type type, int indent, int indent_step,
                                StructDef * /*union_sd*/, std::string *_text) {
  std::string &text = *_text;
  text += NumToString(val);
}